

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

void Ifn_NtkParseConstraints(char *pStr,Ifn_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  
  p->nConstr = 0;
  iVar2 = p->nInps;
  if (0 < iVar2) {
    iVar1 = 0;
    do {
      cVar4 = *pStr;
      if (cVar4 != '\0') {
        pcVar3 = pStr + 1;
        do {
          if ((iVar1 + 0x41 == (int)cVar4) && (pcVar3[-2] == ';')) {
            iVar2 = p->nConstr;
            if (0x78 < (long)iVar2) {
              __assert_fail("p->nConstr < IFN_INS*IFN_INS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                            ,0x1b0,"void Ifn_NtkParseConstraints(char *, Ifn_Ntk_t *)");
            }
            cVar4 = *pcVar3;
            p->nConstr = iVar2 + 1;
            p->pConstr[iVar2] = (int)cVar4 - 0x41U | (iVar1 + 0x41) * 0x10000 - 0x410000U;
          }
          cVar4 = *pcVar3;
          pcVar3 = pcVar3 + 1;
        } while (cVar4 != '\0');
        iVar2 = p->nInps;
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

void Ifn_NtkParseConstraints( char * pStr, Ifn_Ntk_t * p )
{
    int i, k;
    // parse constraints
    p->nConstr = 0;
    for ( i = 0; i < p->nInps; i++ )
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'A' + i && pStr[k-1] == ';' )
            {
                assert( p->nConstr < IFN_INS*IFN_INS );
                p->pConstr[p->nConstr++] = ((int)(pStr[k] - 'A') << 16) | (int)(pStr[k+1] - 'A');
//                printf( "Added constraint (%c < %c)\n", pStr[k], pStr[k+1] );
            }
//    if ( p->nConstr )
//        printf( "Total constraints = %d\n", p->nConstr );
}